

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_push_rect_uv
               (nk_draw_list *list,nk_vec2 a,nk_vec2 c,nk_vec2 uva,nk_vec2 uvc,nk_color color)

{
  uint uVar1;
  uint6 uVar2;
  nk_vec2 uv;
  nk_vec2 pos;
  nk_vec2 uv_00;
  nk_vec2 pos_00;
  void *pvVar3;
  nk_draw_index *pnVar4;
  nk_convert_config *config;
  nk_draw_index nVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  float local_a8;
  float fStack_a4;
  float local_98;
  float fStack_94;
  
  uVar1 = list->vertex_count;
  pvVar3 = nk_draw_list_alloc_vertices(list,4);
  pnVar4 = nk_draw_list_alloc_elements(list,6);
  if (pnVar4 != (nk_draw_index *)0x0 && pvVar3 != (void *)0x0) {
    local_a8 = c.x;
    fStack_a4 = c.y;
    local_98 = uvc.x;
    fStack_94 = uvc.y;
    fVar9 = (float)((uint)color >> 0x10 & 0xff) * 0.003921569;
    fVar8 = (float)((uint)color >> 0x18) * 0.003921569;
    color_02.a = fVar8;
    color_02.b = fVar9;
    uVar2 = CONCAT24(color._1_2_,color) & 0xff000000ff;
    fVar6 = (float)(int)uVar2 * 0.003921569;
    fVar7 = (float)(ushort)(uVar2 >> 0x20) * 0.003921569;
    nVar5 = (nk_draw_index)uVar1;
    *pnVar4 = nVar5;
    pnVar4[1] = nVar5 + 1;
    pnVar4[2] = nVar5 + 2;
    pnVar4[3] = nVar5;
    pnVar4[4] = nVar5 + 2;
    pnVar4[5] = nVar5 + 3;
    config = &list->config;
    pvVar3 = nk_draw_vertex(pvVar3,config,a,uva,
                            (nk_colorf)CONCAT88(CONCAT44(fVar8,fVar9),CONCAT44(fVar7,fVar6)));
    pos.y = a.y;
    pos.x = local_a8;
    uv.y = uva.y;
    uv.x = local_98;
    color_00.b = fVar9;
    color_00.a = fVar8;
    color_00.r = fVar6;
    color_00.g = fVar7;
    pvVar3 = nk_draw_vertex(pvVar3,config,pos,uv,color_00);
    color_01.b = fVar9;
    color_01.a = fVar8;
    color_01.r = fVar6;
    color_01.g = fVar7;
    pvVar3 = nk_draw_vertex(pvVar3,config,c,uvc,color_01);
    pos_00.y = fStack_a4;
    pos_00.x = a.x;
    uv_00.y = fStack_94;
    uv_00.x = uva.x;
    color_02.r = fVar6;
    color_02.g = fVar7;
    nk_draw_vertex(pvVar3,config,pos_00,uv_00,color_02);
    return;
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_list_push_rect_uv(struct nk_draw_list *list, struct nk_vec2 a,
struct nk_vec2 c, struct nk_vec2 uva, struct nk_vec2 uvc,
struct nk_color color)
{
void *vtx;
struct nk_vec2 uvb;
struct nk_vec2 uvd;
struct nk_vec2 b;
struct nk_vec2 d;

struct nk_colorf col;
nk_draw_index *idx;
nk_draw_index index;
NK_ASSERT(list);
if (!list) return;

nk_color_fv(&col.r, color);
uvb = nk_vec2(uvc.x, uva.y);
uvd = nk_vec2(uva.x, uvc.y);
b = nk_vec2(c.x, a.y);
d = nk_vec2(a.x, c.y);

index = (nk_draw_index)list->vertex_count;
vtx = nk_draw_list_alloc_vertices(list, 4);
idx = nk_draw_list_alloc_elements(list, 6);
if (!vtx || !idx) return;

idx[0] = (nk_draw_index)(index+0); idx[1] = (nk_draw_index)(index+1);
idx[2] = (nk_draw_index)(index+2); idx[3] = (nk_draw_index)(index+0);
idx[4] = (nk_draw_index)(index+2); idx[5] = (nk_draw_index)(index+3);

vtx = nk_draw_vertex(vtx, &list->config, a, uva, col);
vtx = nk_draw_vertex(vtx, &list->config, b, uvb, col);
vtx = nk_draw_vertex(vtx, &list->config, c, uvc, col);
vtx = nk_draw_vertex(vtx, &list->config, d, uvd, col);
}